

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_reference.h
# Opt level: O0

range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_> * __thiscall
bv::internal::range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096ul>::array>>::
operator=(range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_> *this,
         const_range_reference<bv::internal::bitview<std::vector>_> *ref)

{
  range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_> *in_RDI;
  size_t unaff_retaddr;
  bitview<std::vector> *in_stack_00000018;
  bitview<bv::internal::bitarray_t<4096UL>::array> *in_stack_00000020;
  
  bitview<bv::internal::bitarray_t<4096UL>::array>::copy<std::vector>
            (in_stack_00000020,in_stack_00000018,(size_t)this,(size_t)ref,unaff_retaddr,
             (size_t)in_RDI);
  return in_RDI;
}

Assistant:

range_reference const&
            operator=(const_range_reference<C1> const&ref) const
            {
                _v.copy(ref._v,
                        ref._begin, ref._end,
                            _begin,     _end);
                
                return *this;
            }